

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

uint64_t sx_hash_xxh64_digest(sx_hash_xxh64_t *state)

{
  ulong len;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  U64 UVar4;
  ulong in_RCX;
  XXH64_state_t *xstate;
  long lVar5;
  XXH_alignment in_R8D;
  
  len = *(ulong *)state;
  if (len < 0x20) {
    lVar5 = *(long *)(state + 0x18) + 0x27d4eb2f165667c5;
  }
  else {
    lVar5 = *(long *)(state + 8);
    uVar1 = *(ulong *)(state + 0x10);
    uVar2 = *(ulong *)(state + 0x18);
    uVar3 = *(ulong *)(state + 0x20);
    in_R8D = 0x85ebca87;
    in_RCX = ((uVar1 * -0x6c158a5880000000 | uVar1 * -0x3d4d51c2d82b14b1 >> 0x21) *
              -0x61c8864e7a143579 ^
             ((lVar5 * -0x6c158a5880000000 | (ulong)(lVar5 * -0x3d4d51c2d82b14b1) >> 0x21) *
              -0x61c8864e7a143579 ^
             (uVar3 << 0x12 | uVar3 >> 0x2e) + (uVar2 << 0xc | uVar2 >> 0x34) +
             (uVar1 << 7 | uVar1 >> 0x39) + (lVar5 << 1 | (ulong)(lVar5 < 0))) * -0x61c8864e7a143579
             + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    lVar5 = ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^ in_RCX) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
            -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  UVar4 = XXH64_finalize(lVar5 + len,state + 0x28,len,(XXH_endianess)in_RCX,in_R8D);
  return UVar4;
}

Assistant:

uint64_t sx_hash_xxh64_digest(sx_hash_xxh64_t* state)
{
    XXH64_state_t* xstate = (XXH64_state_t*)state;
    return XXH64_digest(xstate);
}